

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestRedactedMessage::ByteSizeLong(TestRedactedMessage *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  uVar1 = *(uint *)&this->field_0;
  if ((char)uVar1 == '\0') {
    sVar3 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      sVar3 = 0;
    }
    else {
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.text_field_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.meta_annotated_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.repeated_meta_annotated_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 8) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.unredacted_repeated_annotations_.tagged_ptr_
                                 .ptr_ & 0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.unreported_non_meta_debug_redact_field_.
                                 tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 2;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.redactable_false_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 2;
    }
    if ((uVar1 & 0x40) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.test_direct_message_enum_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 2;
    }
    if ((char)uVar1 < '\0') {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.test_nested_message_enum_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 2;
    }
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.test_redacted_message_enum_.tagged_ptr_.ptr_
                         & 0xfffffffffffffffc));
      sVar3 = sVar3 + sVar2 + 2;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Any>
                        ((this->field_0)._impl_.any_field_);
      sVar3 = sVar3 + sVar2 + 2;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestRedactedMessage::ByteSizeLong() const {
  const TestRedactedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestRedactedMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string text_field = 1 [deprecated = true];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_text_field());
    }
    // string meta_annotated = 8 [(.proto2_unittest.meta_annotated_enum) = TEST_REDACTABLE];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_meta_annotated());
    }
    // string repeated_meta_annotated = 9 [(.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT, (.proto2_unittest.repeated_meta_annotated_enum) = TEST_REDACTABLE];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_repeated_meta_annotated());
    }
    // string unredacted_repeated_annotations = 10 [(.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT, (.proto2_unittest.repeated_meta_annotated_enum) = TEST_NO_REDACT_AGAIN];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_unredacted_repeated_annotations());
    }
    // string unreported_non_meta_debug_redact_field = 17 [debug_redact = true];
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_unreported_non_meta_debug_redact_field());
    }
    // string redactable_false = 19 [(.proto2_unittest.meta_annotated_enum) = TEST_REDACTABLE_FALSE];
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_redactable_false());
    }
    // string test_direct_message_enum = 22 [(.proto2_unittest.test_nested_message_enum) = {
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_test_direct_message_enum());
    }
    // string test_nested_message_enum = 23 [(.proto2_unittest.test_nested_message_enum) = {
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_test_nested_message_enum());
    }
  }
  if ((cached_has_bits & 0x00000300u) != 0) {
    // string test_redacted_message_enum = 24 [(.proto2_unittest.test_nested_message_enum) = {
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_test_redacted_message_enum());
    }
    // .google.protobuf.Any any_field = 18 [debug_redact = true];
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.any_field_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}